

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O0

gdImagePtr gdImageCreateFromGdPtr(int size,void *data)

{
  gdIOCtx *in_00;
  gdIOCtx *in;
  gdImagePtr im;
  void *data_local;
  gdImagePtr pgStack_10;
  int size_local;
  
  in_00 = gdNewDynamicCtxEx(size,data,0);
  if (in_00 == (gdIOCtx *)0x0) {
    pgStack_10 = (gdImagePtr)0x0;
  }
  else {
    pgStack_10 = gdImageCreateFromGdCtx(in_00);
    (*in_00->gd_free)(in_00);
  }
  return pgStack_10;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGdPtr (int size, void *data)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewDynamicCtxEx (size, data, 0);
	if(!in)
		return 0;
	im = gdImageCreateFromGdCtx (in);
	in->gd_free (in);
	return im;
}